

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v10::detail::compile_parse_context<char>::next_arg_id(compile_parse_context<char> *this)

{
  int iVar1;
  int id;
  compile_parse_context<char> *this_local;
  
  iVar1 = basic_format_parse_context<char>::next_arg_id
                    (&this->super_basic_format_parse_context<char>);
  if (*(int *)&(this->super_basic_format_parse_context<char>).field_0x14 <= iVar1) {
    throw_format_error("argument not found");
  }
  return iVar1;
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    int id = base::next_arg_id();
    if (id >= num_args_) throw_format_error("argument not found");
    return id;
  }